

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_filter.cpp
# Opt level: O1

bool __thiscall BamTools::FilterTool::FilterToolPrivate::ParseScript(FilterToolPrivate *this)

{
  string *psVar1;
  size_t __n;
  bool bVar2;
  bool bVar3;
  Value *pVVar4;
  ostream *poVar5;
  ValueHolder VVar6;
  int iVar7;
  ValueHolder VVar8;
  const_iterator cVar9;
  string filterName;
  string errs;
  string ruleString;
  Value root;
  Value filters;
  Value id;
  string document;
  CharReaderBuilder rbuilder;
  Value rule;
  istringstream sin;
  string local_4a8;
  string local_488;
  ValueHolder local_468;
  size_t local_460;
  undefined1 local_458 [24];
  ValueIteratorBase local_440;
  Value local_430;
  Value local_408;
  ValueHolder local_3e0 [2];
  undefined1 local_3d0 [24];
  SelfType local_3b8;
  undefined1 *local_3a8 [2];
  undefined1 local_398 [16];
  string local_388;
  CharReaderBuilder local_368;
  ValueHolder local_338 [2];
  char local_328 [112];
  ios_base local_2b8 [264];
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  GetScriptContents_abi_cxx11_(&local_388,this);
  std::__cxx11::istringstream::istringstream(local_1b0,(string *)&local_388,_S_in);
  Json::Value::Value(&local_430,nullValue);
  Json::CharReaderBuilder::CharReaderBuilder(&local_368);
  local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
  local_488._M_string_length = 0;
  local_488.field_2._M_local_buf[0] = '\0';
  bVar2 = Json::parseFromStream(&local_368.super_Factory,(istream *)local_1b0,&local_430,&local_488)
  ;
  if (!bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "bamtools filter ERROR: failed to parse script - see error message(s) below",0x4a);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
    std::ostream::put('(');
    poVar5 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,local_488._M_dataplus._M_p,local_488._M_string_length);
    bVar2 = false;
    goto LAB_00158b3c;
  }
  pVVar4 = Json::Value::operator[](&local_430,"filters");
  Json::Value::Value(&local_408,pVVar4);
  bVar2 = Json::Value::isNull(&local_408);
  if (bVar2) {
    VVar8.string_ = local_328;
    local_338[0].string_ = VVar8.string_;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"ROOT","");
    bVar2 = ParseFilterObject(this,(string *)local_338,&local_430);
    VVar6 = local_338[0];
  }
  else {
    cVar9 = Json::Value::begin(&local_408);
    local_440.current_ = cVar9.super_ValueIteratorBase.current_._M_node;
    local_440.isNull_ = cVar9.super_ValueIteratorBase.isNull_;
    cVar9 = Json::Value::end(&local_408);
    local_3b8.current_ = cVar9.super_ValueIteratorBase.current_._M_node;
    local_3b8.isNull_ = cVar9.super_ValueIteratorBase.isNull_;
    iVar7 = 0;
    bVar2 = true;
    while( true ) {
      bVar3 = Json::ValueIteratorBase::isEqual(&local_440,&local_3b8);
      if (bVar3) break;
      pVVar4 = Json::ValueIteratorBase::deref(&local_440);
      Json::Value::Value((Value *)&local_468,pVVar4);
      local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
      local_4a8._M_string_length = 0;
      local_4a8.field_2._M_local_buf[0] = '\0';
      pVVar4 = Json::Value::operator[]((Value *)&local_468,"id");
      Json::Value::Value((Value *)local_3e0,pVVar4);
      bVar3 = Json::Value::isNull((Value *)local_3e0);
      if (bVar3) {
        std::__cxx11::stringstream::stringstream((stringstream *)&local_338[0].bool_);
        std::ostream::operator<<(local_328,iVar7);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)&local_4a8,(string *)local_3a8);
        if (local_3a8[0] != local_398) {
          operator_delete(local_3a8[0]);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&local_338[0].bool_);
        std::ios_base::~ios_base(local_2b8);
      }
      else {
        Json::Value::asString_abi_cxx11_((string *)local_338,(Value *)local_3e0);
        std::__cxx11::string::operator=((string *)&local_4a8,(string *)&local_338[0].bool_);
        if (local_338[0] != local_328) {
          operator_delete(local_338[0].string_);
        }
      }
      bVar3 = ParseFilterObject(this,&local_4a8,(Value *)&local_468);
      Json::Value::~Value((Value *)local_3e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
        operator_delete(local_4a8._M_dataplus._M_p);
      }
      Json::Value::~Value((Value *)&local_468);
      Json::ValueIteratorBase::increment(&local_440);
      bVar2 = (bool)(bVar2 & bVar3);
      iVar7 = iVar7 + 1;
    }
    VVar8.string_ = local_458;
    local_460 = 0;
    local_458[0] = 0;
    local_468.string_ = VVar8.string_;
    pVVar4 = Json::Value::operator[](&local_430,"rule");
    Json::Value::Value((Value *)local_338,pVVar4);
    bVar3 = Json::Value::isString((Value *)local_338);
    if (bVar3) {
      Json::Value::asString_abi_cxx11_((string *)local_3e0,(Value *)local_338);
      std::__cxx11::string::operator=((string *)&local_468.bool_,(string *)&local_3e0[0].bool_);
      if (local_3e0[0] != local_3d0) {
        operator_delete(local_3e0[0].string_);
      }
    }
    psVar1 = &(this->m_filterEngine).m_ruleString;
    __n = (this->m_filterEngine).m_ruleString._M_string_length;
    if (__n == local_460) {
      if (__n != 0) {
        iVar7 = bcmp((psVar1->_M_dataplus)._M_p,local_468.string_,__n);
        if (iVar7 != 0) goto LAB_00158af3;
      }
    }
    else {
LAB_00158af3:
      std::__cxx11::string::_M_assign((string *)psVar1);
      FilterEngine<BamTools::BamAlignmentChecker>::buildRuleQueue(&this->m_filterEngine);
    }
    Json::Value::~Value((Value *)local_338);
    VVar6 = local_468;
  }
  if (VVar6.int_ != VVar8.int_) {
    operator_delete(VVar6.string_);
  }
  Json::Value::~Value(&local_408);
LAB_00158b3c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488._M_dataplus._M_p != &local_488.field_2) {
    operator_delete(local_488._M_dataplus._M_p);
  }
  Json::CharReaderBuilder::~CharReaderBuilder(&local_368);
  Json::Value::~Value(&local_430);
  std::__cxx11::istringstream::~istringstream(local_1b0);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p);
  }
  return bVar2;
}

Assistant:

bool FilterTool::FilterToolPrivate::ParseScript()
{

    // read in script contents from file
    const std::string document = GetScriptContents();
    std::istringstream sin(document);

    // set up JsonCPP reader and attempt to parse script
    Json::Value root;
    Json::CharReaderBuilder rbuilder;
    std::string errs;
    const bool ok = Json::parseFromStream(rbuilder, sin, &root, &errs);
    if (!ok) {
        // use built-in error reporting mechanism to alert user what was wrong with the script
        std::cerr << "bamtools filter ERROR: failed to parse script - see error message(s) below"
                  << std::endl
                  << errs;
        return false;
    }

    // initialize return status
    bool success = true;

    // see if root object contains multiple filters
    const Json::Value filters = root["filters"];
    if (!filters.isNull()) {

        // iterate over any filters found
        int filterIndex = 0;
        Json::Value::const_iterator filtersIter = filters.begin();
        Json::Value::const_iterator filtersEnd = filters.end();
        for (; filtersIter != filtersEnd; ++filtersIter, ++filterIndex) {
            Json::Value filter = (*filtersIter);

            // convert filter index to string
            std::string filterName;

            // if id tag supplied
            const Json::Value id = filter["id"];
            if (!id.isNull()) filterName = id.asString();

            // use array index
            else {
                std::stringstream convert;
                convert << filterIndex;
                filterName = convert.str();
            }

            // create & parse filter
            success &= ParseFilterObject(filterName, filter);
        }

        // see if user defined a "rule" for these filters
        // otherwise, use filter engine's default rule behavior
        std::string ruleString;
        const Json::Value rule = root["rule"];
        if (rule.isString()) ruleString = rule.asString();
        m_filterEngine.setRule(ruleString);

        // return success/fail
        return success;
    }

    // otherwise, root is the only filter (just contains properties)
    // create & parse filter named "ROOT"
    else
        success = ParseFilterObject("ROOT", root);

    // return success/failure
    return success;
}